

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1-server.c
# Opt level: O3

void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)

{
  BinarySink *bs;
  void **ppvVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  uint uVar4;
  PktInQueue *pPVar5;
  LogContext *pLVar6;
  ptrlen username;
  ptrlen username_00;
  ptrlen username_01;
  ptrlen username_02;
  ptrlen username_03;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  _Bool _Var14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  ProgressReceiverVtable *in_RAX;
  PktIn *pPVar18;
  BinaryPacketProtocol *pBVar19;
  char *pcVar20;
  toplevel_callback_fn_t p_Var21;
  PrimeGenerationContext *pgc;
  unsigned_long uVar22;
  ulong uVar23;
  strbuf *outbuf;
  size_t sVar24;
  void *__s;
  void *pvVar25;
  mp_int *pmVar26;
  RSAKey *pRVar27;
  mp_int *lo;
  mp_int *x;
  size_t sVar28;
  uchar *puVar29;
  ssh_hash *psVar30;
  PktOut *pPVar31;
  Ssh *pSVar32;
  ssh_cipheralg *cipher;
  char *pcVar33;
  size_t sVar34;
  BinarySource *src;
  ptrlen password;
  ptrlen bytes;
  ptrlen pl2;
  ptrlen pl2_00;
  ptrlen pVar35;
  ProgressReceiver null_progress;
  ProgressReceiver local_38;
  
  local_38.vt = in_RAX;
  _Var14 = ssh1_common_filter_queue(ppl);
  if (_Var14) {
    return;
  }
  iVar17 = *(int *)&ppl[-2].vt;
  if (0x10f < iVar17) {
    if (iVar17 == 0x110) goto LAB_0012d5b7;
    if (iVar17 == 0x164) goto LAB_0012d8c5;
    if (iVar17 == 0x192) goto LAB_0012d4b8;
LAB_0012d0b0:
    *(undefined4 *)&ppl[-2].vt = 0;
    return;
  }
  if (iVar17 == 0) {
    if (ppl[-1].ic_process_queue.fn == (toplevel_callback_fn_t)0x0) {
      iVar17 = *(int *)((long)ppl[-1].ic_process_queue.ctx + 4);
      p_Var21 = (toplevel_callback_fn_t)safemalloc(1,0x48,0);
      ppl[-1].ic_process_queue.fn = p_Var21;
      pgc = probprime_new_context(&primegen_probabilistic);
      local_38.vt = &null_progress_vt;
      rsa_generate((RSAKey *)ppl[-1].ic_process_queue.fn,
                   (uint)(iVar17 < 0x300) * 0x200 + iVar17 + -0x100,false,pgc,&local_38);
      (*pgc->vt->free_context)(pgc);
      *(undefined8 *)(ppl[-1].ic_process_queue.fn + 0x38) = 0;
      ppl[-1].ic_process_queue.queued = true;
    }
    *(undefined4 *)((long)&ppl[-2].out_pq + 4) = 0;
    pLVar6 = ppl[-1].logctx;
    ppl[-2].ic_process_queue.fn = (toplevel_callback_fn_t)ppl[-2].in_pq[3].pqb.end.prev;
    ppl[-2].ic_process_queue.ctx = (void *)0x0;
    uVar16 = auth_methods((AuthPolicy *)pLVar6);
    *(uint *)&ppl[-1].seat = uVar16;
    if ((uVar16 & 2) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 8;
    }
    if ((uVar16 & 4) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 4;
    }
    if ((uVar16 & 0x10) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 0x20;
    }
    if ((uVar16 & 0x20) != 0) {
      pbVar2 = (byte *)((long)&ppl[-2].ic_process_queue.ctx + 2);
      *pbVar2 = *pbVar2 | 1;
    }
    puVar3 = &ppl[-2].ic_process_queue.field_0x14;
    random_read(puVar3,8);
    pPVar31 = (*ppl->bpp->vt->new_pktout)(2);
    bs = pPVar31->binarysink_;
    BinarySink_put_data(bs,puVar3,8);
    rsa_ssh1_public_blob(bs,(RSAKey *)ppl[-1].ic_process_queue.fn,RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob(bs,(RSAKey *)ppl[-1].ic_process_queue.ctx,RSA_SSH1_EXPONENT_FIRST);
    BinarySink_put_uint32(bs,(long)*(int *)((long)&ppl[-2].out_pq + 4));
    BinarySink_put_uint32(bs,(unsigned_long)ppl[-2].ic_process_queue.fn);
    BinarySink_put_uint32(bs,(unsigned_long)ppl[-2].ic_process_queue.ctx);
    pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
    *(undefined4 *)&ppl[-2].vt = 0xaf;
LAB_0012d23a:
    _Var14 = ssh1_common_filter_queue(ppl);
    if (_Var14) {
      return;
    }
    pPVar5 = ppl->in_pq;
    pPVar18 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
    if (pPVar18 == (PktIn *)0x0) {
      return;
    }
    uVar16 = pPVar18->type;
    if (uVar16 != 3) {
      pSVar32 = ppl->ssh;
      pcVar20 = ssh1_pkt_type(uVar16);
      pcVar33 = "Received unexpected packet in response to initial public key packet, type %d (%s)";
      goto LAB_0012d558;
    }
    src = pPVar18->binarysource_;
    bVar15 = BinarySource_get_byte(src);
    *(uint *)&ppl[-2].ic_process_queue.queued = (uint)bVar15;
    pVar35 = BinarySource_get_data(src,8);
    pmVar26 = BinarySource_get_mp_ssh1(src);
    ppl[-1].selfptr = (PacketProtocolLayer **)pmVar26;
    uVar22 = BinarySource_get_uint32(src);
    *(int *)&ppl[-2].out_pq = (int)uVar22;
    if (pPVar18->binarysource_[0].err != BSE_NO_ERROR) {
      pSVar32 = ppl->ssh;
      pcVar20 = "Unable to parse session key packet";
LAB_0012d421:
      ssh_proto_error(pSVar32,pcVar20);
      return;
    }
    puVar3 = &ppl[-2].ic_process_queue.field_0x14;
    pl2.len = 8;
    pl2.ptr = puVar3;
    _Var14 = ptrlen_eq_ptrlen(pVar35,pl2);
    if (!_Var14) {
      pSVar32 = ppl->ssh;
      pcVar20 = "Client sent incorrect anti-spoofing cookie";
      goto LAB_0012d421;
    }
    uVar23 = (ulong)*(uint *)&ppl[-2].ic_process_queue.queued;
    if ((0x1f < uVar23) || (((ulong)ppl[-2].ic_process_queue.fn >> (uVar23 & 0x3f) & 1) == 0)) {
      pSVar32 = ppl->ssh;
      pcVar20 = "Client selected an unsupported cipher";
      goto LAB_0012d421;
    }
    outbuf = strbuf_new_nm();
    sVar28 = mp_get_nbits(*(mp_int **)((long)ppl[-1].ic_process_queue.ctx + 8));
    sVar24 = mp_get_nbits(*(mp_int **)(ppl[-1].ic_process_queue.fn + 8));
    pRVar27 = *(RSAKey **)((long)ppl + (ulong)(sVar28 <= sVar24) * 8 + -0x48);
    _Var14 = rsa_ssh1_decrypt_pkcs1
                       ((mp_int *)ppl[-1].selfptr,
                        *(RSAKey **)((long)ppl + (ulong)(sVar24 < sVar28) * 8 + -0x48),outbuf);
    if (_Var14) {
      mp_free((mp_int *)ppl[-1].selfptr);
      pVar35.ptr = outbuf->u;
      pVar35.len = outbuf->len;
      pmVar26 = mp_from_bytes_be(pVar35);
      ppl[-1].selfptr = (PacketProtocolLayer **)pmVar26;
      strbuf_shrink_to(outbuf,0);
      _Var14 = rsa_ssh1_decrypt_pkcs1((mp_int *)ppl[-1].selfptr,pRVar27,outbuf);
      if ((_Var14) && (outbuf->len == 0x20)) {
        puVar29 = outbuf->u;
        uVar11 = *(undefined8 *)puVar29;
        uVar12 = *(undefined8 *)(puVar29 + 8);
        uVar13 = *(undefined8 *)(puVar29 + 0x18);
        *(undefined8 *)((long)&ppl[-2].seat + 4) = *(undefined8 *)(puVar29 + 0x10);
        *(undefined8 *)((long)&ppl[-2].interactor + 4) = uVar13;
        *(undefined8 *)((long)&ppl[-2].selfptr + 4) = uVar11;
        *(undefined8 *)((long)&ppl[-2].logctx + 4) = uVar12;
        mp_free((mp_int *)ppl[-1].selfptr);
        ppl[-1].selfptr = (PacketProtocolLayer **)0x0;
      }
    }
    strbuf_free(outbuf);
    if (ppl[-1].selfptr != (PacketProtocolLayer **)0x0) {
      pSVar32 = ppl->ssh;
      pcVar20 = "Failed to decrypt session key";
      goto LAB_0012d421;
    }
    ssh1_compute_session_id
              ((uchar *)((long)&ppl[-2].ssh + 4),puVar3,(RSAKey *)ppl[-1].ic_process_queue.ctx,
               (RSAKey *)ppl[-1].ic_process_queue.fn);
    uVar16 = ppl[-2].remote_bugs;
    uVar4 = *(uint *)&ppl[-2].field_0x64;
    uVar7 = *(uint *)&ppl[-1].vt;
    uVar8 = *(uint *)&ppl[-2].logctx;
    uVar9 = *(uint *)((long)&ppl[-2].logctx + 4);
    uVar10 = *(uint *)&ppl[-2].seat;
    *(uint *)((long)&ppl[-2].selfptr + 4) =
         *(uint *)((long)&ppl[-2].selfptr + 4) ^ *(uint *)((long)&ppl[-2].ssh + 4);
    *(uint *)&ppl[-2].logctx = uVar8 ^ uVar16;
    *(uint *)((long)&ppl[-2].logctx + 4) = uVar9 ^ uVar4;
    *(uint *)&ppl[-2].seat = uVar10 ^ uVar7;
    iVar17 = *(int *)&ppl[-2].ic_process_queue.queued;
    if (iVar17 == 2) {
      cipher = &ssh_des;
    }
    else {
      cipher = &ssh_3des_ssh1;
    }
    if (iVar17 == 6) {
      cipher = &ssh_blowfish_ssh1;
    }
    ssh1_bpp_new_cipher(ppl->bpp,cipher,(void *)((long)&ppl[-2].selfptr + 4));
    pPVar31 = (*ppl->bpp->vt->new_pktout)(0xe);
    pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
    *(undefined4 *)&ppl[-2].vt = 0xfd;
  }
  else {
    if (iVar17 == 0xaf) goto LAB_0012d23a;
    if (iVar17 != 0xfd) goto LAB_0012d0b0;
  }
  _Var14 = ssh1_common_filter_queue(ppl);
  if (_Var14) {
    return;
  }
  pPVar5 = ppl->in_pq;
  pPVar18 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
  if (pPVar18 == (PktIn *)0x0) {
    return;
  }
  uVar16 = pPVar18->type;
  if (uVar16 == 4) {
    pVar35 = BinarySource_get_string(pPVar18->binarysource_);
    ppl[-1].in_pq = (PktInQueue *)pVar35.ptr;
    ppl[-1].out_pq = (PktOutQueue *)pVar35.len;
    pBVar19 = (BinaryPacketProtocol *)mkstr(pVar35);
    ppl[-1].bpp = pBVar19;
    ppl[-1].in_pq = (PktInQueue *)pBVar19;
    pLVar6 = ppl->logctx;
    uVar16 = string_length_for_printf((size_t)ppl[-1].out_pq);
    pcVar20 = dupprintf("Received username \'%.*s\'",(ulong)uVar16,ppl[-1].in_pq);
    logevent_and_free(pLVar6,pcVar20);
    username.ptr = ppl[-1].in_pq;
    username.len = (size_t)ppl[-1].out_pq;
    _Var14 = auth_none((AuthPolicy *)ppl[-1].logctx,username);
    do {
      if (_Var14 != false) {
LAB_0012d93a:
        username_03.ptr = ppl[-1].in_pq;
        username_03.len = (size_t)ppl[-1].out_pq;
        _Var14 = auth_successful((AuthPolicy *)ppl[-1].logctx,username_03,
                                 *(uint *)((long)&ppl[-1].seat + 4));
        if (_Var14) {
          pPVar31 = (*ppl->bpp->vt->new_pktout)(0xe);
          pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
          ssh1_connection_set_protoflags
                    ((PacketProtocolLayer *)ppl[-2].bpp,*(int *)((long)&ppl[-2].out_pq + 4),
                     *(int *)&ppl[-2].out_pq);
          pBVar19 = ppl[-2].bpp;
          ppl[-2].bpp = (BinaryPacketProtocol *)0x0;
          ssh_ppl_replace(ppl,(PacketProtocolLayer *)pBVar19);
          return;
        }
        ssh_sw_abort(ppl->ssh,"Multiple authentications required but SSH-1 cannot perform them");
        return;
      }
LAB_0012d591:
      pPVar31 = (*ppl->bpp->vt->new_pktout)(0xf);
      pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
      *(undefined4 *)&ppl[-2].vt = 0x110;
LAB_0012d5b7:
      _Var14 = ssh1_common_filter_queue(ppl);
      if (_Var14) {
        return;
      }
      pPVar5 = ppl->in_pq;
      pPVar18 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
      if (pPVar18 == (PktIn *)0x0) {
        return;
      }
      iVar17 = pPVar18->type;
      if (iVar17 < 0x27) {
        if (iVar17 != 6) {
          if ((iVar17 == 9) &&
             (*(undefined4 *)((long)&ppl[-1].seat + 4) = 2, ((ulong)ppl[-1].seat & 2) != 0)) {
            pVar35 = BinarySource_get_string(pPVar18->binarysource_);
            __s = pVar35.ptr;
            pvVar25 = memchr(__s,0,pVar35.len);
            sVar34 = (long)pvVar25 - (long)__s;
            if (pvVar25 == (void *)0x0) {
              sVar34 = pVar35.len;
            }
            username_00.ptr = ppl[-1].in_pq;
            username_00.len = (size_t)ppl[-1].out_pq;
            password.len = sVar34;
            password.ptr = __s;
            iVar17 = auth_password((AuthPolicy *)ppl[-1].logctx,username_00,password,(ptrlen *)0x0);
            if (iVar17 != 0) goto LAB_0012d93a;
          }
          goto LAB_0012d591;
        }
        *(undefined4 *)((long)&ppl[-1].seat + 4) = 4;
        if (((ulong)ppl[-1].seat & 4) != 0) {
          pmVar26 = BinarySource_get_mp_ssh1(pPVar18->binarysource_);
          username_02.ptr = ppl[-1].in_pq;
          username_02.len = (size_t)ppl[-1].out_pq;
          pRVar27 = auth_publickey_ssh1((AuthPolicy *)ppl[-1].logctx,username_02,pmVar26);
          *(RSAKey **)&ppl[-1].remote_bugs = pRVar27;
          if ((pRVar27 == (RSAKey *)0x0) &&
             (*(char *)((long)&ppl[-2].in_pq[3].pqb.end.formal_size + 2) == '\x01')) {
            lo = mp_from_integer(0);
            x = mp_random_in_range_fn(lo,pmVar26,random_read);
            pPVar31 = (*ppl->bpp->vt->new_pktout)(7);
            BinarySink_put_mp_ssh1(pPVar31->binarysink_,x);
            pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
            mp_free(lo);
            mp_free(x);
          }
          mp_free(pmVar26);
          if (*(long *)&ppl[-1].remote_bugs == 0) {
            if (*(char *)((long)&ppl[-2].in_pq[3].pqb.end.formal_size + 2) == '\0')
            goto LAB_0012d591;
LAB_0012d8bb:
            *(undefined4 *)&ppl[-2].vt = 0x164;
LAB_0012d8c5:
            _Var14 = ssh1_common_filter_queue(ppl);
            if (_Var14) {
              return;
            }
            pPVar5 = ppl->in_pq;
            pPVar18 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
            if (pPVar18 == (PktIn *)0x0) {
              return;
            }
            uVar16 = pPVar18->type;
            if (uVar16 != 8) {
              pSVar32 = ppl->ssh;
              pcVar20 = ssh1_pkt_type(uVar16);
              pcVar33 = "Received unexpected packet in response to RSA auth challenge, type %d (%s)"
              ;
              goto LAB_0012d558;
            }
            if (*(long *)&ppl[-1].remote_bugs == 0) goto LAB_0012d591;
            pVar35 = BinarySource_get_data(pPVar18->binarysource_,0x10);
            pl2_00.len = 0x10;
            pl2_00.ptr = &ppl[-1].interactor;
            _Var14 = ptrlen_eq_ptrlen(pVar35,pl2_00);
            pcVar20 = "Wrong response to auth challenge";
            if (_Var14) goto LAB_0012d93a;
          }
          else {
            sVar28 = (size_t)*(int *)(*(long *)&ppl[-1].remote_bugs + 4);
            pcVar20 = "Auth key far too small";
            if (0x1f < (long)sVar28) {
              puVar29 = (uchar *)safemalloc(sVar28,1,0);
              random_read(puVar29,0x20);
              psVar30 = md5_new(&ssh_md5);
              if (psVar30 != (ssh_hash *)0x0) {
                (*psVar30->vt->reset)(psVar30);
              }
              BinarySink_put_data(psVar30->binarysink_,puVar29,0x20);
              BinarySink_put_data(psVar30->binarysink_,(void *)((long)&ppl[-2].ssh + 4),0x10);
              (*psVar30->vt->digest)(psVar30,(uchar *)&ppl[-1].interactor);
              (*psVar30->vt->free)(psVar30);
              _Var14 = rsa_ssh1_encrypt(puVar29,0x20,*(RSAKey **)&ppl[-1].remote_bugs);
              if (_Var14) {
                bytes.len = (size_t)*(int *)(*(long *)&ppl[-1].remote_bugs + 4);
                bytes.ptr = puVar29;
                pmVar26 = mp_from_bytes_be(bytes);
                smemclr(puVar29,(long)*(int *)(*(long *)&ppl[-1].remote_bugs + 4));
                safefree(puVar29);
                pPVar31 = (*ppl->bpp->vt->new_pktout)(7);
                BinarySink_put_mp_ssh1(pPVar31->binarysink_,pmVar26);
                pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
                mp_free(pmVar26);
                goto LAB_0012d8bb;
              }
              safefree(puVar29);
              pcVar20 = "Failed to encrypt auth challenge";
            }
          }
          pLVar6 = ppl->logctx;
          pcVar20 = dupprintf(pcVar20);
          logevent_and_free(pLVar6,pcVar20);
        }
        goto LAB_0012d591;
      }
      if ((iVar17 != 0x27) && (iVar17 != 0x46)) goto LAB_0012d591;
      uVar16 = (uint)(iVar17 != 0x27) * 0x10 + 0x10;
      *(uint *)((long)&ppl[-1].seat + 4) = uVar16;
      if (((*(uint *)&ppl[-1].seat & uVar16) == 0) ||
         (username_01.ptr = ppl[-1].in_pq, username_01.len = (size_t)ppl[-1].out_pq,
         pcVar20 = auth_ssh1int_challenge((AuthPolicy *)ppl[-1].logctx,uVar16,username_01),
         pcVar20 == (char *)0x0)) goto LAB_0012d591;
      iVar17 = 0x47;
      if (*(int *)((long)&ppl[-1].seat + 4) == 0x10) {
        iVar17 = 0x28;
      }
      pPVar31 = (*ppl->bpp->vt->new_pktout)(iVar17);
      BinarySink_put_stringz(pPVar31->binarysink_,pcVar20);
      pq_base_push(&ppl->out_pq->pqb,&pPVar31->qnode);
      safefree(pcVar20);
      *(undefined4 *)&ppl[-2].vt = 0x192;
LAB_0012d4b8:
      _Var14 = ssh1_common_filter_queue(ppl);
      if (_Var14) {
        return;
      }
      pPVar5 = ppl->in_pq;
      pPVar18 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
      if (pPVar18 == (PktIn *)0x0) {
        return;
      }
      iVar17 = *(int *)((long)&ppl[-1].seat + 4);
      uVar16 = 0x48;
      if (iVar17 == 0x10) {
        uVar16 = 0x29;
      }
      uVar4 = pPVar18->type;
      if (uVar4 != uVar16) {
        pSVar32 = ppl->ssh;
        pcVar20 = "CryptoCard";
        if (iVar17 == 0x10) {
          pcVar20 = "TIS";
        }
        pcVar33 = ssh1_pkt_type(uVar4);
        ssh_proto_error(pSVar32,
                        "Received unexpected packet in response to %s challenge, type %d (%s)",
                        pcVar20,(ulong)uVar4,pcVar33);
        return;
      }
      pVar35 = BinarySource_get_string(pPVar18->binarysource_);
      _Var14 = auth_ssh1int_response((AuthPolicy *)ppl[-1].logctx,pVar35);
    } while( true );
  }
  pSVar32 = ppl->ssh;
  pcVar20 = ssh1_pkt_type(uVar16);
  pcVar33 = "Received unexpected packet while expecting username, type %d (%s)";
LAB_0012d558:
  ssh_proto_error(pSVar32,pcVar33,(ulong)uVar16,pcVar20);
  return;
}

Assistant:

static void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh1_login_server_state *s =
        container_of(ppl, struct ssh1_login_server_state, ppl);
    PktIn *pktin;
    PktOut *pktout;
    int i;

    /* Filter centrally handled messages off the front of the queue on
     * every entry to this coroutine, no matter where we're resuming
     * from, even if we're _not_ looping on pq_pop. That way we can
     * still proactively handle those messages even if we're waiting
     * for a user response. */
    if (ssh1_login_server_filter_queue(s))
        return;

    crBegin(s->crState);

    if (!s->servkey) {
        int server_key_bits = s->hostkey->bytes - 256;
        if (server_key_bits < 512)
            server_key_bits = s->hostkey->bytes + 256;
        s->servkey = snew(RSAKey);

        PrimeGenerationContext *pgc = primegen_new_context(
            &primegen_probabilistic);
        ProgressReceiver null_progress;
        null_progress.vt = &null_progress_vt;
        rsa_generate(s->servkey, server_key_bits, false, pgc, &null_progress);
        primegen_free_context(pgc);

        s->servkey->comment = NULL;
        s->servkey_generated_here = true;
    }

    s->local_protoflags = SSH1_PROTOFLAGS_SUPPORTED;
    s->supported_ciphers_mask = s->ssc->ssh1_cipher_mask;
    s->supported_auths_mask = 0;
    s->ap_methods = auth_methods(s->authpolicy);
    if (s->ap_methods & AUTHMETHOD_PASSWORD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_PASSWORD);
    if (s->ap_methods & AUTHMETHOD_PUBLICKEY)
        s->supported_auths_mask |= (1U << SSH1_AUTH_RSA);
    if (s->ap_methods & AUTHMETHOD_TIS)
        s->supported_auths_mask |= (1U << SSH1_AUTH_TIS);
    if (s->ap_methods & AUTHMETHOD_CRYPTOCARD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_CCARD);

    random_read(s->cookie, 8);

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_PUBLIC_KEY);
    put_data(pktout, s->cookie, 8);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->servkey, RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->hostkey, RSA_SSH1_EXPONENT_FIRST);
    put_uint32(pktout, s->local_protoflags);
    put_uint32(pktout, s->supported_ciphers_mask);
    put_uint32(pktout, s->supported_auths_mask);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_SESSION_KEY) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet in response"
                        " to initial public key packet, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }

    {
        ptrlen client_cookie;
        s->cipher_type = get_byte(pktin);
        client_cookie = get_data(pktin, 8);
        s->sesskey = get_mp_ssh1(pktin);
        s->remote_protoflags = get_uint32(pktin);

        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh, "Unable to parse session key packet");
            return;
        }
        if (!ptrlen_eq_ptrlen(client_cookie, make_ptrlen(s->cookie, 8))) {
            ssh_proto_error(s->ppl.ssh,
                            "Client sent incorrect anti-spoofing cookie");
            return;
        }
    }
    if (s->cipher_type >= 32 ||
        !((s->supported_ciphers_mask >> s->cipher_type) & 1)) {
        ssh_proto_error(s->ppl.ssh, "Client selected an unsupported cipher");
        return;
    }

    {
        RSAKey *smaller, *larger;
        strbuf *data = strbuf_new_nm();

        if (mp_get_nbits(s->hostkey->modulus) >
            mp_get_nbits(s->servkey->modulus)) {
            larger = s->hostkey;
            smaller = s->servkey;
        } else {
            smaller = s->hostkey;
            larger = s->servkey;
        }

        if (rsa_ssh1_decrypt_pkcs1(s->sesskey, larger, data)) {
            mp_free(s->sesskey);
            s->sesskey = mp_from_bytes_be(ptrlen_from_strbuf(data));
            strbuf_clear(data);
            if (rsa_ssh1_decrypt_pkcs1(s->sesskey, smaller, data) &&
                data->len == sizeof(s->session_key)) {
                memcpy(s->session_key, data->u, sizeof(s->session_key));
                mp_free(s->sesskey);
                s->sesskey = NULL;     /* indicates success */
            }
        }

        strbuf_free(data);
    }
    if (s->sesskey) {
        ssh_proto_error(s->ppl.ssh, "Failed to decrypt session key");
        return;
    }

    ssh1_compute_session_id(s->session_id, s->cookie, s->hostkey, s->servkey);

    for (i = 0; i < 16; i++)
        s->session_key[i] ^= s->session_id[i];

    {
        const ssh_cipheralg *cipher =
            (s->cipher_type == SSH1_CIPHER_BLOWFISH ? &ssh_blowfish_ssh1 :
             s->cipher_type == SSH1_CIPHER_DES ? &ssh_des : &ssh_3des_ssh1);
        ssh1_bpp_new_cipher(s->ppl.bpp, cipher, s->session_key);
    }

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_USER) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet while "
                        "expecting username, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }
    s->username = get_string(pktin);
    s->username.ptr = s->username_str = mkstr(s->username);
    ppl_logevent("Received username '%.*s'", PTRLEN_PRINTF(s->username));

    if (auth_none(s->authpolicy, s->username))
        goto auth_success;

    while (1) {
        /* Signal failed authentication */
        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_FAILURE);
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
        if (pktin->type == SSH1_CMSG_AUTH_PASSWORD) {
            s->current_method = AUTHMETHOD_PASSWORD;
            if (!(s->ap_methods & s->current_method))
                continue;

            ptrlen password = get_string(pktin);

            /* Tolerate historic traffic-analysis defence of NUL +
             * garbage on the end of the binary password string */
            char *nul = memchr(password.ptr, '\0', password.len);
            if (nul)
                password.len = (const char *)nul - (const char *)password.ptr;

            if (auth_password(s->authpolicy, s->username, password, NULL))
                goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_RSA) {
            s->current_method = AUTHMETHOD_PUBLICKEY;
            if (!(s->ap_methods & s->current_method))
                continue;

            {
                mp_int *modulus = get_mp_ssh1(pktin);
                s->authkey = auth_publickey_ssh1(
                    s->authpolicy, s->username, modulus);

                if (!s->authkey &&
                    s->ssc->stunt_pretend_to_accept_any_pubkey) {
                    mp_int *zero = mp_from_integer(0);
                    mp_int *fake_challenge = mp_random_in_range(zero, modulus);

                    pktout = ssh_bpp_new_pktout(
                        s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                    put_mp_ssh1(pktout, fake_challenge);
                    pq_push(s->ppl.out_pq, pktout);

                    mp_free(zero);
                    mp_free(fake_challenge);
                }

                mp_free(modulus);
            }

            if (!s->authkey &&
                !s->ssc->stunt_pretend_to_accept_any_pubkey)
                continue;

            if (s->authkey && s->authkey->bytes < 32) {
                ppl_logevent("Auth key far too small");
                continue;
            }

            if (s->authkey) {
                unsigned char *rsabuf =
                    snewn(s->authkey->bytes, unsigned char);

                random_read(rsabuf, 32);

                {
                    ssh_hash *h = ssh_hash_new(&ssh_md5);
                    put_data(h, rsabuf, 32);
                    put_data(h, s->session_id, 16);
                    ssh_hash_final(h, s->auth_rsa_expected_response);
                }

                if (!rsa_ssh1_encrypt(rsabuf, 32, s->authkey)) {
                    sfree(rsabuf);
                    ppl_logevent("Failed to encrypt auth challenge");
                    continue;
                }

                mp_int *bn = mp_from_bytes_be(
                    make_ptrlen(rsabuf, s->authkey->bytes));
                smemclr(rsabuf, s->authkey->bytes);
                sfree(rsabuf);

                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                put_mp_ssh1(pktout, bn);
                pq_push(s->ppl.out_pq, pktout);

                mp_free(bn);
            }

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            if (pktin->type != SSH1_CMSG_AUTH_RSA_RESPONSE) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to RSA auth challenge, type %d (%s)",
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            if (!s->authkey)
                continue;

            {
                ptrlen response = get_data(pktin, 16);
                ptrlen expected = make_ptrlen(
                    s->auth_rsa_expected_response, 16);
                if (!ptrlen_eq_ptrlen(response, expected)) {
                    ppl_logevent("Wrong response to auth challenge");
                    continue;
                }
            }

            goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_TIS ||
                   pktin->type == SSH1_CMSG_AUTH_CCARD) {
            char *challenge;
            unsigned response_type;
            ptrlen response;

            s->current_method = (pktin->type == SSH1_CMSG_AUTH_TIS ?
                                 AUTHMETHOD_TIS : AUTHMETHOD_CRYPTOCARD);
            if (!(s->ap_methods & s->current_method))
                continue;

            challenge = auth_ssh1int_challenge(
                s->authpolicy, s->current_method, s->username);
            if (!challenge)
                continue;
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp,
                (s->current_method == AUTHMETHOD_TIS ?
                 SSH1_SMSG_AUTH_TIS_CHALLENGE :
                 SSH1_SMSG_AUTH_CCARD_CHALLENGE));
            put_stringz(pktout, challenge);
            pq_push(s->ppl.out_pq, pktout);
            sfree(challenge);

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            response_type = (s->current_method == AUTHMETHOD_TIS ?
                             SSH1_CMSG_AUTH_TIS_RESPONSE :
                             SSH1_CMSG_AUTH_CCARD_RESPONSE);
            if (pktin->type != response_type) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to %s challenge, type %d (%s)",
                                (s->current_method == AUTHMETHOD_TIS ?
                                 "TIS" : "CryptoCard"),
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            response = get_string(pktin);

            if (auth_ssh1int_response(s->authpolicy, response))
                goto auth_success;
        }
    }

  auth_success:
    if (!auth_successful(s->authpolicy, s->username, s->current_method)) {
        ssh_sw_abort(s->ppl.ssh, "Multiple authentications required but SSH-1"
                     " cannot perform them");
        return;
    }

    /* Signal successful authentication */
    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    ssh1_connection_set_protoflags(
        s->successor_layer, s->local_protoflags, s->remote_protoflags);
    {
        PacketProtocolLayer *successor = s->successor_layer;
        s->successor_layer = NULL;     /* avoid freeing it ourself */
        ssh_ppl_replace(&s->ppl, successor);
        return;   /* we've just freed s, so avoid even touching s->crState */
    }

    crFinishV;
}